

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pipe.cpp
# Opt level: O0

void just_test_test_case_f_test_pipe_write_and_read(void)

{
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  int __fd;
  char *__pipedes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  allocator<char> local_a1;
  string local_a0;
  assert_equal local_80;
  allocator<char> local_41;
  string local_40 [36];
  fds local_1c;
  undefined1 local_14 [8];
  pipe p;
  
  just::process::impl::pipe::fds::fds(&local_1c);
  just::process::impl::pipe::pipe((pipe *)local_14,(int *)local_1c._fd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"Hello",&local_41);
  __fd = (int)local_40;
  just::process::impl::output_file::write((output_file *)&p,__fd,__buf,in_RCX);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  just::process::impl::output_file::close((output_file *)&p,__fd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/process/test/test_pipe.cpp"
             ,&local_a1);
  just::test::assert_equal::assert_equal(&local_80,&local_a0,0x18);
  just::process::impl::input_file::read_abi_cxx11_
            ((input_file *)&local_c8,(int)local_14,__buf_00,in_RCX);
  __pipedes = "Hello";
  just::test::assert_equal::operator()(&local_80,"Hello",&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  just::test::assert_equal::~assert_equal(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  just::process::impl::pipe::~pipe((pipe *)local_14,(int *)__pipedes);
  return;
}

Assistant:

JUST_TEST_CASE(test_pipe_write_and_read)
{
  just::process::impl::pipe p;
  p.output.write("Hello");
  p.output.close();

  JUST_ASSERT_EQUAL("Hello", p.input.read());
}